

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O1

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkBRUS(CB3DMeshFileLoader *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  pointer pSVar3;
  pointer pSVar4;
  SB3dTexture *pSVar5;
  SB3dTexture *pSVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  SColor SVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar12;
  uint uVar13;
  pointer pSVar15;
  long lVar16;
  void *__src;
  int iVar17;
  long lVar18;
  ulong uVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  u32 n_texs;
  string name;
  s32 texture_id;
  uint local_174;
  ulong local_170;
  s32 *local_168;
  long local_160;
  ulong local_158;
  array<irr::scene::SB3dMaterial> *local_150;
  string local_148;
  SB3dMaterial local_128;
  ulong uVar14;
  
  (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_174,4);
  uVar9 = local_174;
  local_170 = 4;
  if (local_174 < 4) {
    local_170 = (ulong)local_174;
  }
  iVar8 = local_174 - (uint)local_170;
  if (local_174 < (uint)local_170) {
    iVar8 = 0;
  }
  lVar18 = *(long *)&(this->super_IMeshLoader).field_0x10;
  iVar17 = *(int *)(lVar18 + -0xc);
  lVar18 = *(long *)(lVar18 + -8);
  iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
  if (CONCAT44(extraout_var,iVar10) < iVar17 + lVar18) {
    local_150 = &this->Materials;
    local_158 = (ulong)((int)local_170 - 1);
    uVar12 = local_170 & 0xffffffff;
    local_160 = local_158 * 8 + -0x18;
    do {
      readString_abi_cxx11_(&local_148,this);
      video::SMaterial::SMaterial(&local_128.Material);
      local_128.red = 1.0;
      local_128.green = 1.0;
      local_128.blue = 1.0;
      local_128.alpha = 1.0;
      local_128.shininess = 0.0;
      local_128.blend = 1;
      local_128.fx = 0;
      local_128.Textures[2] = (SB3dTexture *)0x0;
      local_128.Textures[3] = (SB3dTexture *)0x0;
      local_128.Textures[0] = (SB3dTexture *)0x0;
      local_128.Textures[1] = (SB3dTexture *)0x0;
      ::std::vector<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>::
      emplace_back<irr::scene::SB3dMaterial>(&local_150->m_data,&local_128);
      (this->Materials).is_sorted = false;
      lVar18 = 0x80;
      do {
        pvVar2 = *(void **)((long)local_128.Material.TextureLayers + lVar18 + -8);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,0x40);
        }
        lVar18 = lVar18 + -0x20;
      } while (lVar18 != 0);
      pSVar3 = (this->Materials).m_data.
               super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].red,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].green,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].blue,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].alpha,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].shininess,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar3[-1].blend,4);
      local_168 = &pSVar3[-1].fx;
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_168,4);
      if (uVar9 != 0) {
        uVar19 = 0;
        do {
          local_128.Material.TextureLayers[0].Texture =
               (ITexture *)CONCAT44(local_128.Material.TextureLayers[0].Texture._4_4_,0xffffffff);
          (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_128,4);
          pSVar4 = (this->Textures).m_data.
                   super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar15 = pSVar4 + ((ulong)local_128.Material.TextureLayers[0].Texture & 0xffffffff);
          if ((uint)((ulong)((long)(this->Textures).m_data.
                                   super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4) >> 6)
              <= (uint)local_128.Material.TextureLayers[0].Texture) {
            pSVar15 = (pointer)0x0;
          }
          *(pointer *)((long)((pSVar3->Material).TextureLayers + -1) + uVar19 * 8) = pSVar15;
          uVar19 = uVar19 + 1;
        } while (uVar12 != uVar19);
      }
      uVar19 = local_158;
      iVar17 = iVar8;
      if (4 < uVar9) {
        do {
          local_128.Material.TextureLayers[0].Texture =
               (ITexture *)CONCAT44(local_128.Material.TextureLayers[0].Texture._4_4_,0xffffffff);
          (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_128,4);
          if (((this->ShowWarning == true) &&
              ((uint)local_128.Material.TextureLayers[0].Texture != -1)) && (4 < local_174)) {
            (*this->B3DFile->_vptr_IReadFile[4])();
            os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            this->ShowWarning = false;
          }
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      pSVar5 = pSVar3[-1].Textures[0];
      if ((pSVar5 != (SB3dTexture *)0x0) && ((pSVar5->Flags & 0x10000) != 0)) {
        pSVar6 = pSVar3[-1].Textures[1];
        pSVar3[-1].Textures[1] = pSVar5;
        pSVar3[-1].Textures[0] = pSVar6;
      }
      if (uVar9 != 0) {
        lVar18 = 0;
        uVar14 = local_170;
        do {
          uVar13 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar13;
          lVar16 = lVar18;
          if (uVar13 < (uint)uVar19) {
            do {
              lVar7 = *(long *)((long)&(pSVar3->Material).TextureLayers[0].Texture +
                               lVar16 * 8 + local_160);
              if ((lVar7 != 0) &&
                 (*(long *)((long)(pSVar3->Material).TextureLayers + lVar16 * 8 + local_160 + -8) ==
                  0)) {
                *(long *)((long)(pSVar3->Material).TextureLayers + lVar16 * 8 + local_160 + -8) =
                     lVar7;
                *(undefined8 *)
                 ((long)&(pSVar3->Material).TextureLayers[0].Texture + lVar16 * 8 + local_160) = 0;
              }
              lVar16 = lVar16 + 1;
            } while ((int)lVar16 != 0);
          }
          lVar18 = lVar18 + -1;
        } while (uVar13 != 0);
      }
      if (pSVar3[-1].Textures[1] == (SB3dTexture *)0x0) {
        if (pSVar3[-1].Textures[0] == (SB3dTexture *)0x0) {
LAB_001b10f1:
          if (((float)pSVar3[-1].alpha != 1.0) || (NAN((float)pSVar3[-1].alpha))) goto LAB_001b101d;
          pSVar3[-1].Material.MaterialType = EMT_SOLID;
        }
        else {
          uVar13 = pSVar3[-1].Textures[0]->Flags;
          if ((uVar13 & 2) != 0) {
            pSVar3[-1].Material.MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL;
            goto LAB_001b1024;
          }
          if ((uVar13 & 4) == 0) goto LAB_001b10f1;
          pSVar3[-1].Material.MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL_REF;
        }
      }
      else {
LAB_001b101d:
        pSVar3[-1].Material.MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
LAB_001b1024:
        puVar1 = &pSVar3[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xcf;
      }
      local_128.Material.TextureLayers[0].Texture = *(ITexture **)&pSVar3[-1].red;
      local_128.Material.TextureLayers[0]._8_4_ = pSVar3[-1].blue;
      local_128.Material.TextureLayers[0].MinFilter = (E_TEXTURE_MIN_FILTER)pSVar3[-1].alpha;
      SVar11 = video::SColorf::toSColor((SColorf *)&local_128);
      pSVar3[-1].Material.DiffuseColor.color = SVar11.color;
      puVar1 = &pSVar3[-1].Material.field_0xa2;
      *puVar1 = *puVar1 & 0x8f;
      if ((pSVar3[-1].fx & 1) == 0) {
        pSVar3[-1].Material.AmbientColor.color = pSVar3[-1].Material.DiffuseColor.color;
      }
      else {
        pSVar3[-1].Material.AmbientColor.color = 0xffffffff;
        puVar1 = &pSVar3[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xf7;
      }
      if ((*local_168 & 2) != 0) {
        *(ushort *)&pSVar3[-1].Material.field_0xa2 =
             *(ushort *)&pSVar3[-1].Material.field_0xa2 & 0xff8f | 0x50;
      }
      if ((*local_168 & 4) != 0) {
        puVar1 = &pSVar3[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xfb;
      }
      if ((*local_168 & 0x10) != 0) {
        puVar1 = &pSVar3[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xbf;
      }
      if ((*local_168 & 0x20) != 0) {
        pSVar3[-1].Material.MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
        puVar1 = &pSVar3[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xcf;
      }
      pSVar3[-1].Material.Shininess = pSVar3[-1].shininess;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      lVar18 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar17 = *(int *)(lVar18 + -0xc);
      lVar18 = *(long *)(lVar18 + -8);
      iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
    } while (CONCAT44(extraout_var_00,iVar10) < iVar17 + lVar18);
  }
  lVar18 = *(long *)&(this->super_IMeshLoader).field_0x8;
  pvVar2 = *(void **)&(this->super_IMeshLoader).field_0x10;
  uVar12 = (long)pvVar2 + (0xffffffff0 - lVar18) & 0xffffffff0;
  __src = (void *)(lVar18 + uVar12 + 0x10);
  if (__src != pvVar2) {
    memmove((void *)(lVar18 + uVar12),__src,(long)pvVar2 - (long)__src);
  }
  puVar1 = &(this->super_IMeshLoader).field_0x10;
  *(long *)puVar1 = *(long *)puVar1 + -0x10;
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBRUS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBRUS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	u32 n_texs;
	B3DFile->read(&n_texs, sizeof(u32));
#ifdef __BIG_ENDIAN__
	n_texs = os::Byteswap::byteswap(n_texs);
#endif

	// number of texture ids read for Irrlicht
	const u32 num_textures = core::min_(n_texs, video::MATERIAL_MAX_TEXTURES);
	// number of bytes to skip (for ignored texture ids)
	const u32 n_texs_offset = (num_textures < n_texs) ? (n_texs - num_textures) : 0;

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		// This is what blitz basic calls a brush, like a Irrlicht Material

		auto name = readString();
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Material", name.c_str(), ELL_DEBUG);
#endif
		Materials.push_back(SB3dMaterial());
		SB3dMaterial &B3dMaterial = Materials.getLast();

		readFloats(&B3dMaterial.red, 1);
		readFloats(&B3dMaterial.green, 1);
		readFloats(&B3dMaterial.blue, 1);
		readFloats(&B3dMaterial.alpha, 1);
		readFloats(&B3dMaterial.shininess, 1);

		B3DFile->read(&B3dMaterial.blend, sizeof(B3dMaterial.blend));
		B3DFile->read(&B3dMaterial.fx, sizeof(B3dMaterial.fx));
#ifdef __BIG_ENDIAN__
		B3dMaterial.blend = os::Byteswap::byteswap(B3dMaterial.blend);
		B3dMaterial.fx = os::Byteswap::byteswap(B3dMaterial.fx);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Blend", core::stringc(B3dMaterial.blend).c_str(), ELL_DEBUG);
		os::Printer::log("FX", core::stringc(B3dMaterial.fx).c_str(), ELL_DEBUG);
#endif

		u32 i;
		for (i = 0; i < num_textures; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			//--- Get pointers to the texture, based on the IDs ---
			if ((u32)texture_id < Textures.size()) {
				B3dMaterial.Textures[i] = &Textures[texture_id];
#ifdef _B3D_READER_DEBUG
				os::Printer::log("Layer", core::stringc(i).c_str(), ELL_DEBUG);
				os::Printer::log("using texture", Textures[texture_id].TextureName.c_str(), ELL_DEBUG);
#endif
			} else
				B3dMaterial.Textures[i] = 0;
		}
		// skip other texture ids
		for (i = 0; i < n_texs_offset; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			if (ShowWarning && (texture_id != -1) && (n_texs > video::MATERIAL_MAX_TEXTURES)) {
				os::Printer::log("Too many textures used in one material", B3DFile->getFileName(), ELL_WARNING);
				ShowWarning = false;
			}
		}

		// Fixes problems when the lightmap is on the first texture:
		if (B3dMaterial.Textures[0] != 0) {
			if (B3dMaterial.Textures[0]->Flags & 65536) { // 65536 = secondary UV
				SB3dTexture *TmpTexture;
				TmpTexture = B3dMaterial.Textures[1];
				B3dMaterial.Textures[1] = B3dMaterial.Textures[0];
				B3dMaterial.Textures[0] = TmpTexture;
			}
		}

		// If a preceeding texture slot is empty move the others down:
		for (i = num_textures; i > 0; --i) {
			for (u32 j = i - 1; j < num_textures - 1; ++j) {
				if (B3dMaterial.Textures[j + 1] != 0 && B3dMaterial.Textures[j] == 0) {
					B3dMaterial.Textures[j] = B3dMaterial.Textures[j + 1];
					B3dMaterial.Textures[j + 1] = 0;
				}
			}
		}

		//------ Convert blitz flags/blend to irrlicht -------

		// Two textures:
		if (B3dMaterial.Textures[1]) {
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		} else if (B3dMaterial.Textures[0]) { // One texture:
			// Flags & 0x1 is usual SOLID, 0x8 is mipmap (handled before)
			if (B3dMaterial.Textures[0]->Flags & 0x2) { // (Alpha mapped)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			} else if (B3dMaterial.Textures[0]->Flags & 0x4)                                  //(Masked)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL_REF; // TODO: create color key texture
			else if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		} else // No texture:
		{
			if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		}

		B3dMaterial.Material.DiffuseColor = video::SColorf(B3dMaterial.red, B3dMaterial.green, B3dMaterial.blue, B3dMaterial.alpha).toSColor();
		B3dMaterial.Material.ColorMaterial = video::ECM_NONE;

		//------ Material fx ------

		if (B3dMaterial.fx & 1) { // full-bright
			B3dMaterial.Material.AmbientColor = video::SColor(255, 255, 255, 255);
			B3dMaterial.Material.Lighting = false;
		} else
			B3dMaterial.Material.AmbientColor = B3dMaterial.Material.DiffuseColor;

		if (B3dMaterial.fx & 2) // use vertex colors instead of brush color
			B3dMaterial.Material.ColorMaterial = video::ECM_DIFFUSE_AND_AMBIENT;

		if (B3dMaterial.fx & 4) // flatshaded
			B3dMaterial.Material.GouraudShading = false;

		if (B3dMaterial.fx & 16) // disable backface culling
			B3dMaterial.Material.BackfaceCulling = false;

		if (B3dMaterial.fx & 32) { // force vertex alpha-blending
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		}

		B3dMaterial.Material.Shininess = B3dMaterial.shininess;
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}